

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O0

void D4C(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
        int fft_size,D4COption *option,double **aperiodicity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int number_of_aperiodicities_00;
  int y_length;
  ulong uVar6;
  double *y;
  double *aperiodicity0_00;
  double *coarse_aperiodicity_00;
  double *coarse_frequency_axis_00;
  double *frequency_axis_00;
  double dVar7;
  int local_e8;
  int local_e4;
  int i_2;
  int i_1;
  double *frequency_axis;
  int i;
  double *coarse_frequency_axis;
  double *coarse_aperiodicity;
  double *aperiodicity0;
  double *window;
  int window_length;
  int number_of_aperiodicities;
  ForwardRealFFT forward_real_fft;
  int fft_size_d4c;
  RandnState randn_state;
  int f0_length_local;
  double *f0_local;
  double *temporal_positions_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  memset((void *)((long)&forward_real_fft.forward_fft.w + 4),0,0x10);
  randn_reseed((RandnState *)((long)&forward_real_fft.forward_fft.w + 4));
  anon_unknown.dwarf_590f::InitializeAperiodicity(f0_length,fft_size,aperiodicity);
  dVar7 = log(((double)fs * 4.0) / 47.0 + 1.0);
  dVar7 = pow(2.0,(double)(int)(dVar7 / 0.6931471805599453) + 1.0);
  forward_real_fft.forward_fft.w._0_4_ = (int)dVar7;
  memset(&window_length,0,0x60);
  InitializeForwardRealFFT((int)forward_real_fft.forward_fft.w,(ForwardRealFFT *)&window_length);
  dVar7 = MyMinDouble(15000.0,(double)fs / 2.0 - 3000.0);
  number_of_aperiodicities_00 = (int)(dVar7 / 3000.0);
  y_length = (int)(((double)(int)forward_real_fft.forward_fft.w * 3000.0) / (double)fs) * 2 + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)y_length;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar6);
  NuttallWindow(y_length,y);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)f0_length;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  aperiodicity0_00 = (double *)operator_new__(uVar6);
  anon_unknown.dwarf_590f::D4CLoveTrain
            (x,fs,x_length,f0,f0_length,temporal_positions,aperiodicity0_00,
             (RandnState *)((long)&forward_real_fft.forward_fft.w + 4));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(number_of_aperiodicities_00 + 2);
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  coarse_aperiodicity_00 = (double *)operator_new__(uVar6);
  *coarse_aperiodicity_00 = -60.0;
  coarse_aperiodicity_00[number_of_aperiodicities_00 + 1] = -1e-12;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(number_of_aperiodicities_00 + 2);
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  coarse_frequency_axis_00 = (double *)operator_new__(uVar6);
  for (frequency_axis._4_4_ = 0; frequency_axis._4_4_ <= number_of_aperiodicities_00;
      frequency_axis._4_4_ = frequency_axis._4_4_ + 1) {
    coarse_frequency_axis_00[frequency_axis._4_4_] = (double)frequency_axis._4_4_ * 3000.0;
  }
  coarse_frequency_axis_00[number_of_aperiodicities_00 + 1] = (double)fs / 2.0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(fft_size / 2 + 1);
  uVar6 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  frequency_axis_00 = (double *)operator_new__(uVar6);
  for (local_e4 = 0; local_e4 <= fft_size / 2; local_e4 = local_e4 + 1) {
    frequency_axis_00[local_e4] = ((double)local_e4 * (double)fs) / (double)fft_size;
  }
  for (local_e8 = 0; local_e8 < f0_length; local_e8 = local_e8 + 1) {
    if (((f0[local_e8] != 0.0) || (NAN(f0[local_e8]))) &&
       (option->threshold < aperiodicity0_00[local_e8])) {
      dVar7 = MyMaxDouble(47.0,f0[local_e8]);
      anon_unknown.dwarf_590f::D4CGeneralBody
                (x,x_length,fs,dVar7,(int)forward_real_fft.forward_fft.w,
                 temporal_positions[local_e8],number_of_aperiodicities_00,y,y_length,
                 (ForwardRealFFT *)&window_length,coarse_aperiodicity_00 + 1,
                 (RandnState *)((long)&forward_real_fft.forward_fft.w + 4));
      anon_unknown.dwarf_590f::GetAperiodicity
                (coarse_frequency_axis_00,coarse_aperiodicity_00,number_of_aperiodicities_00,
                 frequency_axis_00,fft_size,aperiodicity[local_e8]);
    }
  }
  DestroyForwardRealFFT((ForwardRealFFT *)&window_length);
  if (aperiodicity0_00 != (double *)0x0) {
    operator_delete__(aperiodicity0_00);
  }
  if (coarse_frequency_axis_00 != (double *)0x0) {
    operator_delete__(coarse_frequency_axis_00);
  }
  if (coarse_aperiodicity_00 != (double *)0x0) {
    operator_delete__(coarse_aperiodicity_00);
  }
  if (y != (double *)0x0) {
    operator_delete__(y);
  }
  if (frequency_axis_00 != (double *)0x0) {
    operator_delete__(frequency_axis_00);
  }
  return;
}

Assistant:

void D4C(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    int fft_size, const D4COption *option, double **aperiodicity) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  InitializeAperiodicity(f0_length, fft_size, aperiodicity);

  int fft_size_d4c = static_cast<int>(pow(2.0, 1.0 +
    static_cast<int>(log(4.0 * fs / world::kFloorF0D4C + 1) /
      world::kLog2)));

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size_d4c, &forward_real_fft);

  int number_of_aperiodicities =
    static_cast<int>(MyMinDouble(world::kUpperLimit, fs / 2.0 -
      world::kFrequencyInterval) / world::kFrequencyInterval);
  // Since the window function is common in D4CGeneralBody(),
  // it is designed here to speed up.
  int window_length =
    static_cast<int>(world::kFrequencyInterval * fft_size_d4c / fs) * 2 + 1;
  double *window =  new double[window_length];
  NuttallWindow(window_length, window);

  // D4C Love Train (Aperiodicity of 0 Hz is given by the different algorithm)
  double *aperiodicity0 = new double[f0_length];
  D4CLoveTrain(x, fs, x_length, f0, f0_length, temporal_positions,
      aperiodicity0, &randn_state);

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;
  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  for (int i = 0; i < f0_length; ++i) {
    if (f0[i] == 0 || aperiodicity0[i] <= option->threshold) continue;
    D4CGeneralBody(x, x_length, fs, MyMaxDouble(world::kFloorF0D4C, f0[i]),
        fft_size_d4c, temporal_positions[i], number_of_aperiodicities, window,
        window_length, &forward_real_fft, &coarse_aperiodicity[1], &randn_state);

    // Linear interpolation to convert the coarse aperiodicity into its
    // spectral representation.
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] aperiodicity0;
  delete[] coarse_frequency_axis;
  delete[] coarse_aperiodicity;
  delete[] window;
  delete[] frequency_axis;
}